

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDeprecated.cpp
# Opt level: O0

HighsStatus __thiscall Highs::readHighsOptions(Highs *this,string *filename)

{
  HighsStatus HVar1;
  string *in_stack_00000020;
  Highs *in_stack_00000028;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  Highs *in_stack_ffffffffffffffa0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"readHighsOptions",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"readOptions",(allocator *)&stack0xffffffffffffff97)
  ;
  deprecationMessage(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  HVar1 = readOptions(in_stack_00000028,in_stack_00000020);
  return HVar1;
}

Assistant:

HighsStatus Highs::readHighsOptions(const std::string& filename) {
  deprecationMessage("readHighsOptions", "readOptions");
  return readOptions(filename);
}